

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

int __thiscall QAccessibleTable::indexOfChild(QAccessibleTable *this,QAccessibleInterface *iface)

{
  int iVar1;
  int iVar2;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar3;
  long *plVar4;
  QAbstractItemView *pQVar5;
  QHeaderView *pQVar6;
  QDebug *pQVar7;
  QAccessibleTableHeaderCell *cell;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_a8;
  QModelIndex local_90;
  char *local_78;
  QDebug local_70;
  QDebug local_68;
  undefined1 local_60 [8];
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractItemView *)view(this);
  iVar1 = -1;
  if (this_00 != (QAbstractItemView *)0x0) {
    pQVar3 = QAbstractItemView::model(this_00);
    if (pQVar3 != (QAbstractItemModel *)0x0) {
      plVar4 = (long *)(**(code **)(*(long *)iface + 0x40))(iface);
      pQVar5 = (QAbstractItemView *)(**(code **)(*plVar4 + 0x18))(plVar4);
      if (pQVar5 == this_00) {
        local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_00);
        iVar1 = (**(code **)(*(long *)iface + 0x78))(iface);
        if (iVar1 != 0x1d) {
          iVar1 = (**(code **)(*(long *)iface + 0x78))(iface);
          if (iVar1 != 0x22) {
            iVar1 = (**(code **)(*(long *)iface + 0x78))(iface);
            if (iVar1 == 0x19) {
              iVar1 = *(int *)(iface + 0x18);
              pQVar6 = verticalHeader(this);
              iVar1 = (iVar1 + 1) - (uint)(pQVar6 == (QHeaderView *)0x0);
            }
            else {
              iVar1 = (**(code **)(*(long *)iface + 0x78))(iface);
              if (iVar1 == 0x1a) {
                iVar1 = *(int *)(iface + 0x18);
                iVar2 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_58);
                iVar1 = (iVar2 + 1) * (iVar1 + 1);
              }
              else {
                iVar2 = (**(code **)(*(long *)iface + 0x78))(iface);
                iVar1 = 0;
                if (iVar2 != 0x10) {
                  local_90.r = 2;
                  local_90.m.ptr._4_4_ = 0;
                  local_90._4_8_ = 0;
                  local_90._12_8_ = 0;
                  local_78 = "default";
                  QMessageLogger::warning();
                  pQVar7 = QDebug::operator<<(&local_70,
                                              "WARNING QAccessibleTable::indexOfChild Fix my children..."
                                             );
                  local_68.stream = pQVar7->stream;
                  *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
                  (**(code **)(*(long *)iface + 0x78))(iface);
                  ::operator<<((Stream *)local_60,(Role)&local_68);
                  (**(code **)(*(long *)iface + 0x60))(&QStack_a8,iface,0);
                  QDebug::operator<<((QDebug *)local_60,(QString *)&QStack_a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_a8);
                  QDebug::~QDebug((QDebug *)local_60);
                  QDebug::~QDebug(&local_68);
                  QDebug::~QDebug(&local_70);
                  iVar1 = -1;
                }
              }
            }
            goto LAB_004db26f;
          }
        }
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_90,(QPersistentModelIndex *)(iface + 0x28));
        iVar1 = logicalIndex(this,&local_90);
      }
    }
  }
LAB_004db26f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTable::indexOfChild(const QAccessibleInterface *iface) const
{
    const QAbstractItemView *theView = view();
    if (!theView)
        return -1;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return -1;
    QAccessibleInterface *parent = iface->parent();
    if (parent->object() != theView)
        return -1;

    const QModelIndex rootIndex = theView->rootIndex();
    Q_ASSERT(iface->role() != QAccessible::TreeItem); // should be handled by tree class
    if (iface->role() == QAccessible::Cell || iface->role() == QAccessible::ListItem) {
        const QAccessibleTableCell* cell = static_cast<const QAccessibleTableCell*>(iface);
        return logicalIndex(cell->m_index);
    } else if (iface->role() == QAccessible::ColumnHeader){
        const QAccessibleTableHeaderCell* cell = static_cast<const QAccessibleTableHeaderCell*>(iface);
        return cell->index + (verticalHeader() ? 1 : 0);
    } else if (iface->role() == QAccessible::RowHeader){
        const QAccessibleTableHeaderCell* cell = static_cast<const QAccessibleTableHeaderCell*>(iface);
        return (cell->index + 1) * (theModel->columnCount(rootIndex) + 1);
    } else if (iface->role() == QAccessible::Pane) {
        return 0; // corner button
    } else {
        qWarning() << "WARNING QAccessibleTable::indexOfChild Fix my children..."
                   << iface->role() << iface->text(QAccessible::Name);
    }
    // FIXME: we are in denial of our children. this should stop.
    return -1;
}